

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# overload_1.cxx
# Opt level: O0

int main(void)

{
  ostream *poVar1;
  Int *pIVar2;
  Int local_44;
  Int local_40;
  Int local_3c;
  Int local_38;
  Int local_34;
  Int local_30;
  Int local_2c;
  Int local_28;
  Int local_24;
  Int origin_int_2;
  Int origin_int_1;
  double d;
  int c;
  int b;
  int a;
  
  _origin_int_2 = 12.3;
  Int::Int(&local_24);
  Int::Int(&local_28);
  poVar1 = std::operator<<((ostream *)&std::cout,anon_var_dwarf_689);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  Int::Int(&local_2c,5);
  local_24.value = local_2c.value;
  local_28.value = local_2c.value;
  Int::operator_cast_to_int(&local_24);
  _origin_int_2 = Int::operator_cast_to_double(&local_24);
  poVar1 = (ostream *)
           std::ostream::operator<<((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&std::cout,anon_var_dwarf_6ac);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  Int::Int(&local_30,0);
  local_24.value = local_30.value;
  Int::Int(&local_34,0);
  local_28.value = local_34.value;
  local_38 = Int::operator++(&local_24,0);
  Int::operator_cast_to_int(&local_38);
  pIVar2 = Int::operator++(&local_24);
  Int::operator_cast_to_int(pIVar2);
  local_3c = Int::operator--(&local_24,0);
  Int::operator_cast_to_int(&local_3c);
  pIVar2 = Int::operator--(&local_24);
  Int::operator_cast_to_int(pIVar2);
  pIVar2 = Int::operator++(&local_28);
  Int::operator_cast_to_int(pIVar2);
  poVar1 = (ostream *)
           std::ostream::operator<<((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&std::cout,anon_var_dwarf_6c2);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  Int::Int(&local_40,5);
  local_24.value = local_40.value;
  Int::Int(&local_44,5);
  local_28.value = local_44.value;
  pIVar2 = Int::operator+(&local_24,&local_28);
  Int::operator_cast_to_int(pIVar2);
  poVar1 = (ostream *)
           std::ostream::operator<<((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  return 0;
}

Assistant:

int main() {
    int a = 5, b = 3, c = 10;
    double d = 12.3;
    Int origin_int_1, origin_int_2;

    /*** 代入&返却 ***/
    std::cout << "-------代入と返却-------" << std::endl;
    origin_int_1 = a; //代入
    origin_int_2 = origin_int_1; //代入
    b = origin_int_1; //int型で返却
    d = origin_int_1; //double型で返却

    std::cout << std::endl << std::endl << std::endl << std::endl;


    /*** インクリメント&デクリメント ***/
    std::cout << "-------インクリメントとデクリメント-------" << std::endl;
    origin_int_1 = 0;
    origin_int_2 = 0;
    a = origin_int_1++;
    a = ++origin_int_1;
    b = origin_int_1--;
    b = --origin_int_1;

    b = ++origin_int_2;
    std::cout << std::endl << std::endl << std::endl << std::endl;

    /*** 加算&減算 ***/
    std::cout << "-------加算&減算-------" << std::endl;
    a = 0;
    origin_int_1 = 5;
    origin_int_2 = 5;
    a = origin_int_1 + origin_int_2;
    std::cout << std::endl << std::endl << std::endl << std::endl;

    return 0;
}